

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMultiProcessHandler::LockResources(cmCTestMultiProcessHandler *this,int index)

{
  PropertiesMap *this_00;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  mapped_type *ppcVar1;
  int local_2c;
  
  this_00 = &this->Properties;
  local_2c = index;
  ppcVar1 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_2c);
  __first._M_node =
       ((*ppcVar1)->LockedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ppcVar1 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_2c);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->LockedResources,__first,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&((*ppcVar1)->LockedResources)._M_t._M_impl.super__Rb_tree_header);
  ppcVar1 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_2c);
  if ((*ppcVar1)->RunSerial == true) {
    this->SerialTestRunning = true;
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::LockResources(int index)
{
  this->LockedResources.insert(
      this->Properties[index]->LockedResources.begin(),
      this->Properties[index]->LockedResources.end());

  if (this->Properties[index]->RunSerial)
    {
    this->SerialTestRunning = true;
    }
}